

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gepard-path.cpp
# Opt level: O0

void __thiscall gepard::Path::~Path(Path *this)

{
  PathData *this_00;
  Path *this_local;
  
  if ((this->_pathData != (PathData *)0x0) &&
     (this_00 = this->_pathData, this_00 != (PathData *)0x0)) {
    PathData::~PathData(this_00);
    operator_delete(this_00);
  }
  return;
}

Assistant:

Path::~Path()
{
    if (_pathData) {
        delete _pathData;
    }
}